

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O1

void __thiscall CVmImageWriter::finish(CVmImageWriter *this)

{
  end_block(this);
  begin_block(this,"EOF ",1);
  end_block(this);
  return;
}

Assistant:

void CVmImageWriter::finish()
{
    /* if there's a block open, close it */
    end_block();

    /* 
     *   write the EOF block - the block contains no data, so simply begin
     *   and end it 
     */
    begin_block("EOF ", TRUE);
    end_block();
}